

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rp.cpp
# Opt level: O0

void synchro_or_remove_pair<hf_queue<ll_el<unsigned_int,unsigned_int>,unsigned_int,unsigned_int>>
               (hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int> *Q,TP_t *TP,
               text_t *T,cpair ab)

{
  cpair ab_00;
  uint uVar1;
  char *in_RCX;
  hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int> *in_RDI;
  triple_t tVar2;
  itype L_ab;
  itype F_ab;
  triple_t q_el;
  text_t *in_stack_00000088;
  TP_t *in_stack_00000090;
  hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int> *in_stack_00000098;
  cpair in_stack_000000a0;
  hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int> *in_stack_ffffffffffffffa8
  ;
  uint in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  undefined4 local_40;
  undefined4 uStack_28;
  
  ab_00.second = in_stack_ffffffffffffffb4;
  ab_00.first = in_stack_ffffffffffffffb0;
  tVar2 = hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int>::operator[]
                    (in_stack_ffffffffffffffa8,ab_00);
  local_40 = tVar2.F_ab;
  uStack_28 = tVar2.L_ab;
  if (uStack_28 >> 1 < local_40) {
    uVar1 = hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int>::
            minimum_frequency(in_RDI);
    if (local_40 < uVar1) {
      hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int>::remove(in_RDI,in_RCX)
      ;
    }
  }
  else {
    synchronize<hf_queue<ll_el<unsigned_int,unsigned_int>,unsigned_int,unsigned_int>>
              (in_stack_00000098,in_stack_00000090,in_stack_00000088,in_stack_000000a0);
  }
  return;
}

Assistant:

void synchro_or_remove_pair(queue_t & Q, TP_t & TP, text_t & T, cpair ab){

	assert(Q.contains(ab));

	auto q_el = Q[ab];
	itype F_ab = q_el.F_ab;
	itype L_ab = q_el.L_ab;

	if(F_ab <= L_ab/2){

		synchronize<queue_t>(Q, TP, T, ab);

	}else{

		if(F_ab < Q.minimum_frequency()){

			Q.remove(ab);

		}

	}

}